

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void highbd_bilinear_filter4xh
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  longlong in_RDX;
  undefined1 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 *in_R8;
  int in_R9D;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined2 uVar10;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  __m128i alVar11;
  __m128i res_1;
  __m128i z_2;
  __m128i y_1;
  __m128i x_4;
  __m128i vfilter_vec;
  uint8_t *vfilter;
  __m128i y;
  __m128i x_3;
  __m128i v0;
  __m128i z_1;
  __m128i x_2;
  __m128i res;
  __m128i z1;
  __m128i x1;
  __m128i z0;
  __m128i x0;
  __m128i hfilter_vec;
  uint8_t *hfilter;
  uint16_t *b_2;
  __m128i z;
  __m128i x_1;
  uint16_t *b_1;
  __m128i x;
  uint16_t *b;
  int i;
  __m128i *in_stack_fffffffffffffbe8;
  __m128i *in_stack_fffffffffffffbf0;
  __m128i *in_stack_fffffffffffffbf8;
  __m128i *in_stack_fffffffffffffc00;
  __m128i *in_stack_fffffffffffffc08;
  __m128i *a0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  ulong uStack_3a0;
  undefined1 local_358 [16];
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  uint8_t (*local_328) [2];
  undefined8 *local_320;
  undefined1 local_318 [16];
  undefined8 local_308;
  ulong uStack_300;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d8;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  undefined1 (*local_2b0) [16];
  undefined1 (*local_2a8) [16];
  undefined1 *local_2a0;
  undefined1 (*local_298) [16];
  undefined1 (*local_290) [16];
  undefined8 *local_270;
  undefined8 *local_250;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined8 local_228;
  ulong uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f0;
  __m128i *local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  __m128i *local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 (*local_150) [16];
  undefined1 local_128 [16];
  undefined8 *local_110;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_9c;
  __m128i *local_98;
  undefined8 uStack_90;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  ulong uStack_40;
  undefined8 local_38;
  ulong uStack_30;
  
  local_2b4 = (int)in_RSI;
  local_2b8 = (int)in_RDX;
  local_2cc = in_R9D;
  local_2c8 = in_R8;
  local_2bc = in_ECX;
  local_2b0 = in_RDI;
  if (local_2b8 == 0) {
    local_2d8 = in_R8;
    for (local_2d0 = 0; local_2d0 < in_R9D + 1; local_2d0 = local_2d0 + 1) {
      local_150 = local_2b0;
      local_2e8 = *(undefined8 *)*local_2b0;
      uStack_160 = 0;
      uStack_2e0 = 0;
      local_d0 = local_2d8;
      uStack_e0 = 0;
      *local_2d8 = local_2e8;
      local_2b0 = (undefined1 (*) [16])(*local_2b0 + (long)local_2b4 * 2);
      local_2d8 = local_2d8 + 1;
      local_168 = local_2e8;
      local_e8 = local_2e8;
    }
  }
  else if (local_2b8 == 4) {
    local_2f0 = in_R8;
    for (local_2d0 = 0; local_2d0 < in_R9D + 1; local_2d0 = local_2d0 + 1) {
      local_290 = local_2b0;
      local_308 = *(undefined8 *)*local_2b0;
      uStack_300 = *(ulong *)(*local_2b0 + 8);
      auVar3 = *local_2b0;
      local_f0 = local_2f0;
      local_318._0_8_ = auVar3._2_8_;
      uVar1 = local_318._0_8_;
      local_318._8_8_ = uStack_300 >> 0x10;
      uStack_220 = local_318._8_8_;
      local_218._0_2_ = (undefined2)local_308;
      local_218._2_2_ = (undefined2)((ulong)local_308 >> 0x10);
      local_218._4_2_ = (undefined2)((ulong)local_308 >> 0x20);
      local_218._6_2_ = (undefined2)((ulong)local_308 >> 0x30);
      uStack_210._0_2_ = (undefined2)uStack_300;
      uStack_210._2_2_ = (undefined2)(uStack_300 >> 0x10);
      uStack_210._4_2_ = (undefined2)(uStack_300 >> 0x20);
      uStack_210._6_2_ = (undefined2)(uStack_300 >> 0x30);
      local_228._0_2_ = auVar3._2_2_;
      local_228._2_2_ = auVar3._4_2_;
      local_228._4_2_ = auVar3._6_2_;
      local_228._6_2_ = auVar3._8_2_;
      local_108 = pavgw((undefined2)local_218,(undefined2)local_228);
      uStack_106 = pavgw(local_218._2_2_,local_228._2_2_);
      uStack_104 = pavgw(local_218._4_2_,local_228._4_2_);
      uStack_102 = pavgw(local_218._6_2_,local_228._6_2_);
      uStack_100 = pavgw((undefined2)uStack_210,uStack_210._2_2_);
      uStack_fe = pavgw(uStack_210._2_2_,uStack_210._4_2_);
      uStack_fc = pavgw(uStack_210._4_2_,uStack_210._6_2_);
      uStack_fa = pavgw(uStack_210._6_2_,0);
      *local_2f0 = CONCAT26(uStack_102,CONCAT24(uStack_104,CONCAT22(uStack_106,local_108)));
      local_2b0 = (undefined1 (*) [16])(*local_2b0 + (long)local_2b4 * 2);
      local_2f0 = local_2f0 + 1;
      local_318 = auVar3 >> 0x10;
      local_228 = uVar1;
      local_218 = local_308;
      uStack_210 = uStack_300;
    }
  }
  else {
    local_328 = bilinear_filters_2t + local_2b8;
    local_6c = (uint)(*local_328)[0] | (uint)bilinear_filters_2t[local_2b8][1] << 0x10;
    local_338 = CONCAT44(local_6c,local_6c);
    uStack_330 = CONCAT44(local_6c,local_6c);
    local_320 = in_R8;
    local_68 = local_338;
    uStack_60 = uStack_330;
    local_58 = local_6c;
    local_54 = local_6c;
    local_50 = local_6c;
    local_4c = local_6c;
    for (local_2d0 = 0; local_2d0 < local_2cc; local_2d0 = local_2d0 + 2) {
      local_298 = local_2b0;
      local_348 = *(undefined8 *)*local_2b0;
      uStack_340 = *(undefined8 *)(*local_2b0 + 8);
      local_358 = *local_2b0 >> 0x10;
      local_2a0 = *local_2b0 + (long)local_2b4 * 2;
      in_RSI = local_358;
      alVar11 = highbd_filter_block_2rows
                          (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                           in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                           in_stack_fffffffffffffbe8);
      in_RDX = alVar11[1];
      local_250 = local_320;
      *local_320 = extraout_XMM0_Qa;
      local_320[1] = extraout_XMM0_Qb;
      local_2b0 = (undefined1 (*) [16])(*local_2b0 + (long)(local_2b4 << 1) * 2);
      local_320 = local_320 + 2;
    }
    local_2a8 = local_2b0;
    uVar1 = *(undefined8 *)*local_2b0;
    uStack_30 = *(ulong *)(*local_2b0 + 8);
    auVar3 = *local_2b0;
    local_3a8 = auVar3._2_8_;
    uStack_3a0 = uStack_30 >> 0x10;
    local_48 = local_3a8;
    uVar2 = local_48;
    uStack_40 = uStack_3a0;
    local_38._0_2_ = (undefined2)uVar1;
    local_38._2_2_ = (undefined2)((ulong)uVar1 >> 0x10);
    local_38._4_2_ = (undefined2)((ulong)uVar1 >> 0x20);
    local_38._6_2_ = (undefined2)((ulong)uVar1 >> 0x30);
    local_48._0_2_ = auVar3._2_2_;
    local_48._2_2_ = auVar3._4_2_;
    local_48._4_2_ = auVar3._6_2_;
    local_48._6_2_ = auVar3._8_2_;
    local_3b8._0_4_ = CONCAT22((undefined2)local_48,(undefined2)local_38);
    local_3b8._0_6_ = CONCAT24(local_38._2_2_,(undefined4)local_3b8);
    local_3b8 = CONCAT26(local_48._2_2_,(undefined6)local_3b8);
    uStack_3b0._0_2_ = local_38._4_2_;
    uStack_3b0._2_2_ = local_48._4_2_;
    uStack_3b0._4_2_ = local_38._6_2_;
    uStack_3b0._6_2_ = local_48._6_2_;
    local_b8 = local_3b8;
    uStack_b0 = uStack_3b0;
    local_c8 = local_338;
    uStack_c0 = uStack_330;
    auVar4._8_8_ = uStack_3b0;
    auVar4._0_8_ = local_3b8;
    auVar3._8_8_ = uStack_330;
    auVar3._0_8_ = local_338;
    pmaddwd(auVar4,auVar3);
    alVar11[1] = (longlong)in_RSI;
    alVar11[0] = 7;
    local_48 = uVar2;
    local_38 = uVar1;
    xx_roundn_epu32(alVar11,(int)in_RDX);
    auVar6._8_8_ = extraout_XMM0_Qb_00;
    auVar6._0_8_ = extraout_XMM0_Qa_00;
    auVar5._8_8_ = extraout_XMM0_Qb_00;
    auVar5._0_8_ = extraout_XMM0_Qa_00;
    local_128 = packssdw(auVar6,auVar5);
    local_110 = local_320;
    *local_320 = local_128._0_8_;
  }
  if (local_2bc != 0) {
    if (local_2bc == 4) {
      for (local_2d0 = 0; local_2d0 < local_2cc; local_2d0 = local_2d0 + 1) {
        uVar1 = *local_2c8;
        uVar2 = local_2c8[1];
        local_238 = (undefined2)uVar1;
        uStack_236 = (undefined2)((ulong)uVar1 >> 0x10);
        uStack_234 = (undefined2)((ulong)uVar1 >> 0x20);
        uStack_232 = (undefined2)((ulong)uVar1 >> 0x30);
        local_248 = (undefined2)uVar2;
        uStack_246 = (undefined2)((ulong)uVar2 >> 0x10);
        uStack_244 = (undefined2)((ulong)uVar2 >> 0x20);
        uStack_242 = (undefined2)((ulong)uVar2 >> 0x30);
        uVar7 = pavgw(local_238,local_248);
        uVar8 = pavgw(uStack_236,uStack_246);
        uVar9 = pavgw(uStack_234,uStack_244);
        uVar10 = pavgw(uStack_232,uStack_242);
        pavgw(0,0);
        pavgw(0,0);
        pavgw(0,0);
        pavgw(0,0);
        *local_2c8 = CONCAT26(uVar10,CONCAT24(uVar9,CONCAT22(uVar8,uVar7)));
        local_2c8 = local_2c8 + 1;
      }
    }
    else {
      local_9c = (uint)bilinear_filters_2t[local_2bc][0] |
                 (uint)bilinear_filters_2t[local_2bc][1] << 0x10;
      a0 = (__m128i *)CONCAT44(local_9c,local_9c);
      uStack_90 = CONCAT44(local_9c,local_9c);
      local_98 = a0;
      local_7c = local_9c;
      local_78 = local_9c;
      local_74 = local_9c;
      local_70 = local_9c;
      for (local_2d0 = 0; local_2d0 < local_2cc; local_2d0 = local_2d0 + 2) {
        local_1b0 = local_2c8;
        local_1c8 = (__m128i *)*local_2c8;
        uStack_1c0 = 0;
        local_1d0 = local_2c8 + 1;
        local_1e8 = (__m128i *)*local_1d0;
        uStack_1e0 = 0;
        local_1f0 = local_2c8 + 2;
        local_208 = *local_1f0;
        uStack_200 = 0;
        highbd_filter_block_2rows(a0,(__m128i *)0x0,local_1c8,(__m128i *)0x0,local_1e8);
        local_270 = local_2c8;
        *local_2c8 = extraout_XMM0_Qa_01;
        local_2c8[1] = extraout_XMM0_Qb_01;
        local_2c8 = local_2c8 + 2;
      }
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter4xh(const uint16_t *src, int src_stride,
                                      int xoffset, int yoffset, uint16_t *dst,
                                      int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 2);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu16(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 2);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 2);
      const __m128i res =
          highbd_filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 8;
    }
    // Process i = h separately
    __m128i x = _mm_loadu_si128((__m128i *)src);
    __m128i z = _mm_srli_si128(x, 2);

    __m128i v0 = _mm_unpacklo_epi16(x, z);
    v0 = _mm_madd_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu32(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packs_epi32(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu16(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[4]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i res =
          highbd_filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 8;
    }
  }
}